

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O2

bool __thiscall Loader::setWREN(Loader *this)

{
  bool bVar1;
  char *this_00;
  allocator local_93;
  allocator local_92;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  bVar1 = setIR(this,USER1);
  if (bVar1) {
    this_00 = "06";
    std::__cxx11::string::string((string *)&local_30,"06",&local_91);
    reverseBytes(&local_50,(Loader *)this_00,&local_30);
    std::__cxx11::string::string((string *)&local_70,"",&local_92);
    std::__cxx11::string::string((string *)&local_90,"",&local_93);
    bVar1 = shiftDR(this,8,&local_50,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Loader::setWREN() {
	if (!setIR(USER1))
		return false;
	if (!shiftDR(8, reverseBytes("06"), "", ""))
		return false;
	return true;
}